

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

State * __thiscall anon_unknown.dwarf_5b53fd::Parser::State::operator=(State *this,State *param_1)

{
  __node_base_ptr *pp_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  size_t sVar13;
  size_t sVar14;
  __node_ptr __n;
  __node_base_ptr *pp_Var15;
  
  uVar4 = *(undefined4 *)&param_1->words;
  uVar5 = *(undefined4 *)((long)&param_1->words + 4);
  sVar13 = param_1->num_words;
  uVar6 = *(undefined4 *)((long)&param_1->num_words + 4);
  uVar7 = *(undefined4 *)&param_1->diagnostic;
  uVar8 = *(undefined4 *)((long)&param_1->diagnostic + 4);
  sVar14 = param_1->word_index;
  uVar9 = *(undefined4 *)((long)&param_1->word_index + 4);
  uVar10 = *(undefined4 *)((long)&param_1->instruction_count + 1);
  uVar11 = *(undefined4 *)((long)&param_1->instruction_count + 5);
  uVar12 = *(undefined4 *)((long)&param_1->endian + 1);
  *(undefined4 *)((long)&this->word_index + 5) = *(undefined4 *)((long)&param_1->word_index + 5);
  *(undefined4 *)((long)&this->instruction_count + 1) = uVar10;
  *(undefined4 *)((long)&this->instruction_count + 5) = uVar11;
  *(undefined4 *)((long)&this->endian + 1) = uVar12;
  *(undefined4 *)&this->diagnostic = uVar7;
  *(undefined4 *)((long)&this->diagnostic + 4) = uVar8;
  *(int *)&this->word_index = (int)sVar14;
  *(undefined4 *)((long)&this->word_index + 4) = uVar9;
  *(undefined4 *)&this->words = uVar4;
  *(undefined4 *)((long)&this->words + 4) = uVar5;
  *(int *)&this->num_words = (int)sVar13;
  *(undefined4 *)((long)&this->num_words + 4) = uVar6;
  __n = (__node_ptr)&param_1->id_to_type_id;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->id_to_type_id)._M_h);
  if (param_1 != this) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>_>_>
    ::_M_deallocate_nodes
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>_>_>
                *)(this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt,__n);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_deallocate_buckets(&(this->type_id_to_number_type_info)._M_h);
    uVar4 = *(undefined4 *)&(param_1->type_id_to_number_type_info)._M_h._M_rehash_policy.field_0x4;
    sVar13 = (param_1->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize;
    (this->type_id_to_number_type_info)._M_h._M_rehash_policy._M_max_load_factor =
         (param_1->type_id_to_number_type_info)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(this->type_id_to_number_type_info)._M_h._M_rehash_policy.field_0x4 = uVar4;
    (this->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize = sVar13;
    pp_Var15 = (param_1->type_id_to_number_type_info)._M_h._M_buckets;
    pp_Var1 = &(param_1->type_id_to_number_type_info)._M_h._M_single_bucket;
    if (pp_Var1 == pp_Var15) {
      pp_Var15 = &(this->type_id_to_number_type_info)._M_h._M_single_bucket;
      (this->type_id_to_number_type_info)._M_h._M_single_bucket = *pp_Var1;
    }
    (this->type_id_to_number_type_info)._M_h._M_buckets = pp_Var15;
    uVar2 = (param_1->type_id_to_number_type_info)._M_h._M_bucket_count;
    (this->type_id_to_number_type_info)._M_h._M_bucket_count = uVar2;
    p_Var3 = (param_1->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt;
    (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = p_Var3;
    (this->type_id_to_number_type_info)._M_h._M_element_count =
         (param_1->type_id_to_number_type_info)._M_h._M_element_count;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      pp_Var15[(ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2] =
           &(this->type_id_to_number_type_info)._M_h._M_before_begin;
    }
    (param_1->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize = 0;
    (param_1->type_id_to_number_type_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (param_1->type_id_to_number_type_info)._M_h._M_bucket_count = 1;
    (param_1->type_id_to_number_type_info)._M_h._M_buckets = pp_Var1;
    (param_1->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (param_1->type_id_to_number_type_info)._M_h._M_element_count = 0;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->import_id_to_ext_inst_type)._M_h,&param_1->import_id_to_ext_inst_type);
  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::_M_move_assign
            (&this->operands,&param_1->operands);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->endian_converted_words,&param_1->endian_converted_words);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::_M_move_assign
            (&this->expected_operands,&param_1->expected_operands);
  return this;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }